

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::split_sideways
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          model_node_type *parent,int bucketID,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,bool reuse_model)

{
  int *piVar1;
  longlong *plVar2;
  byte bVar3;
  data_node_type *old_node;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  old_node = (data_node_type *)parent->children_[bucketID];
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)old_node->num_keys_;
  bVar3 = (old_node->super_AlexNode<int,_int>).duplication_factor_;
  iVar7 = 1 << (bVar3 & 0x1f);
  if (iVar7 < 1 << (fanout_tree_depth & 0x1fU)) {
    piVar1 = &(this->stats_).num_model_node_expansions;
    *piVar1 = *piVar1 + 1;
    plVar2 = &(this->stats_).num_model_node_expansion_pointers;
    *plVar2 = *plVar2 + (long)parent->num_children_;
    iVar4 = AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
                      (parent,fanout_tree_depth - (uint)bVar3);
    iVar7 = iVar4 << (bVar3 & 0x1f);
    bucketID = bucketID * iVar4;
  }
  iVar7 = bucketID - bucketID % iVar7;
  if ((used_fanout_tree_nodes->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (used_fanout_tree_nodes->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    if (fanout_tree_depth != 1) {
      __assert_fail("fanout_tree_depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x67f,
                    "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::split_sideways(model_node_type *, int, int, std::vector<fanout_tree::FTNode> &, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                   );
    }
    uVar6 = (uint)(old_node->super_AlexNode<int,_int>).duplication_factor_;
    uVar5 = 1;
    if (1 < uVar6) {
      uVar5 = uVar6;
    }
    create_two_new_data_nodes(this,old_node,parent,uVar5,reuse_model,iVar7);
  }
  else {
    uVar5 = (uint)(old_node->super_AlexNode<int,_int>).duplication_factor_ - fanout_tree_depth;
    create_new_data_nodes
              (this,old_node,parent,fanout_tree_depth,used_fanout_tree_nodes,iVar7,
               ~((int)uVar5 >> 0x1f) & uVar5);
  }
  delete_node(this,(AlexNode<int,_int> *)old_node);
  piVar1 = &(this->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void split_sideways(model_node_type* parent, int bucketID,
                      int fanout_tree_depth,
                      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
                      bool reuse_model) {
    auto leaf = static_cast<data_node_type*>(parent->children_[bucketID]);
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    int fanout = 1 << fanout_tree_depth;
    int repeats = 1 << leaf->duplication_factor_;
    if (fanout > repeats) {
      // Expand the pointer array in the parent model node if there are not
      // enough redundant pointers
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += parent->num_children_;
      int expansion_factor =
          parent->expand(fanout_tree_depth - leaf->duplication_factor_);
      repeats *= expansion_factor;
      bucketID *= expansion_factor;
    }
    int start_bucketID =
        bucketID - (bucketID % repeats);  // first bucket with same child

    if (used_fanout_tree_nodes.empty()) {
      assert(fanout_tree_depth == 1);
      create_two_new_data_nodes(
          leaf, parent,
          std::max(fanout_tree_depth,
                   static_cast<int>(leaf->duplication_factor_)),
          reuse_model, start_bucketID);
    } else {
      // Extra duplication factor is required when there are more redundant
      // pointers than necessary
      int extra_duplication_factor =
          std::max(0, leaf->duplication_factor_ - fanout_tree_depth);
      create_new_data_nodes(leaf, parent, fanout_tree_depth,
                            used_fanout_tree_nodes, start_bucketID,
                            extra_duplication_factor);
    }

    delete_node(leaf);
    stats_.num_data_nodes--;
  }